

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

void __thiscall wabt::TypeChecker::PushType(TypeChecker *this,Type type)

{
  Type local_14;
  TypeChecker *pTStack_10;
  Type type_local;
  TypeChecker *this_local;
  
  if (type != Void) {
    local_14 = type;
    pTStack_10 = this;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(&this->type_stack_,&local_14);
  }
  return;
}

Assistant:

void TypeChecker::PushType(Type type) {
  if (type != Type::Void) {
    type_stack_.push_back(type);
  }
}